

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

int Sfm_LibFindDelayMatches
              (Sfm_Lib_t *p,word *pTruth,int *pFanins,int nFanins,Vec_Ptr_t *vGates,Vec_Ptr_t *vFans
              )

{
  int iVar1;
  int *piVar2;
  Mio_Cell2_t *pMVar3;
  void *local_b0;
  void *local_a0;
  word local_88;
  word pCopy [4];
  int iFunc;
  Mio_Cell2_t *pCellT;
  Mio_Cell2_t *pCellB;
  Sfm_Fun_t *pObj;
  Vec_Ptr_t *vFans_local;
  Vec_Ptr_t *vGates_local;
  int nFanins_local;
  int *pFanins_local;
  word *pTruth_local;
  Sfm_Lib_t *p_local;
  
  if (6 < nFanins) {
    Abc_TtCopy(&local_88,pTruth,4,0);
    Dau_DsdPrintFromTruth(&local_88,p->nVars);
  }
  Vec_PtrClear(vGates);
  Vec_PtrClear(vFans);
  iVar1 = Abc_TtIsConst0(pTruth,p->nWords);
  if (iVar1 == 0) {
    iVar1 = Abc_TtIsConst1(pTruth,p->nWords);
    if (iVar1 == 0) {
      iVar1 = Abc_TtEqual(pTruth,s_Truth8[0],p->nWords);
      if (iVar1 == 0) {
        iVar1 = Abc_TtOpposite(pTruth,s_Truth8[0],p->nWords);
        if (iVar1 == 0) {
          piVar2 = Vec_MemHashLookup(p->vTtMem,pTruth);
          iVar1 = *piVar2;
          if (iVar1 == -1) {
            if ((p->fVerbose != 0) || (6 < nFanins)) {
              printf("Not found in the precomputed library: ");
              Dau_DsdPrintFromTruth(pTruth,nFanins);
            }
            p_local._4_4_ = 0;
          }
          else {
            Vec_IntAddToEntry(&p->vHits,iVar1,1);
            iVar1 = Vec_IntEntry(&p->vLists,iVar1);
            for (pCellB = (Mio_Cell2_t *)Sfm_LibFun(p,iVar1); pCellB != (Mio_Cell2_t *)0x0;
                pCellB = (Mio_Cell2_t *)Sfm_LibFun(p,*(int *)&pCellB->pName)) {
              pMVar3 = p->pCells + (int)*(char *)&pCellB->vExpr;
              Vec_PtrPush(vGates,p->pCells[(int)(char)pCellB->field_0x11].pMioGate);
              if (pMVar3 == p->pCells) {
                local_a0 = (void *)0x0;
              }
              else {
                local_a0 = pMVar3->pMioGate;
              }
              Vec_PtrPush(vGates,local_a0);
              Vec_PtrPush(vFans,&pCellB->field_0x12);
              if (pMVar3 == p->pCells) {
                local_b0 = (void *)0x0;
              }
              else {
                local_b0 = (void *)((long)&pCellB->vExpr + 1);
              }
              Vec_PtrPush(vFans,local_b0);
            }
            iVar1 = Vec_PtrSize(vGates);
            p_local._4_4_ = iVar1 / 2;
          }
          return p_local._4_4_;
        }
      }
    }
  }
  __assert_fail("!Abc_TtIsConst0(pTruth, p->nWords) && !Abc_TtIsConst1(pTruth, p->nWords) && !Abc_TtEqual(pTruth, s_Truth8[0], p->nWords) && !Abc_TtOpposite(pTruth, s_Truth8[0], p->nWords)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                ,0x282,
                "int Sfm_LibFindDelayMatches(Sfm_Lib_t *, word *, int *, int, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

int Sfm_LibFindDelayMatches( Sfm_Lib_t * p, word * pTruth, int * pFanins, int nFanins, Vec_Ptr_t * vGates, Vec_Ptr_t * vFans )
{
    Sfm_Fun_t * pObj;
    Mio_Cell2_t * pCellB, * pCellT;
    int iFunc;
    if ( nFanins > 6 )
    {
        word pCopy[4];
        Abc_TtCopy( pCopy, pTruth, 4, 0 );
        Dau_DsdPrintFromTruth( pCopy, p->nVars );
    }
    Vec_PtrClear( vGates );
    Vec_PtrClear( vFans );
    // look for gate
    assert( !Abc_TtIsConst0(pTruth, p->nWords) && 
            !Abc_TtIsConst1(pTruth, p->nWords) && 
            !Abc_TtEqual(pTruth, s_Truth8[0], p->nWords) && 
            !Abc_TtOpposite(pTruth, s_Truth8[0], p->nWords) );
    iFunc = *Vec_MemHashLookup( p->vTtMem,  pTruth );
    if ( iFunc == -1 )
    {
        // print functions not found in the library
        if ( p->fVerbose || nFanins > 6 )
        {
            printf( "Not found in the precomputed library: " );
            Dau_DsdPrintFromTruth( pTruth, nFanins );
        }
        return 0;
    }
    Vec_IntAddToEntry( &p->vHits, iFunc, 1 );
    // collect matches
    Sfm_LibForEachSuper( p, pObj, iFunc )
    {
        pCellB = p->pCells + (int)pObj->pFansB[0];
        pCellT = p->pCells + (int)pObj->pFansT[0];
        Vec_PtrPush( vGates, pCellB->pMioGate );
        Vec_PtrPush( vGates, pCellT == p->pCells ? NULL : pCellT->pMioGate );
        Vec_PtrPush( vFans, pObj->pFansB + 1 );
        Vec_PtrPush( vFans, pCellT == p->pCells ? NULL : pObj->pFansT + 1 );
    }
    return Vec_PtrSize(vGates) / 2;
}